

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O2

void diy::detail::decide_move_info
               (vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *all_work_info
               ,vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *all_move_info
               )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  pointer pWVar5;
  pointer pWVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  int i;
  ulong uVar11;
  int i_1;
  anon_class_1_0_00000001 cmp;
  value_type work_info;
  undefined4 uStack_74;
  value_type local_64;
  vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *local_58;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  min_proc_work_q;
  
  pMVar4 = (all_move_info->
           super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((all_move_info->
      super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    (all_move_info->
    super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>)._M_impl.
    super__Vector_impl_data._M_finish = pMVar4;
  }
  work_info.proc_rank = 0;
  work_info.top_gid = 0;
  work_info.top_work = 0;
  work_info.proc_work = 0;
  stack0xffffffffffffff88 = 0;
  std::
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
  ::priority_queue(&min_proc_work_q,&cmp,
                   (vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *)
                   &work_info);
  std::_Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::~_Vector_base
            ((_Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *)
             &work_info);
  lVar10 = 0;
  uVar11 = 0;
  while( true ) {
    pWVar5 = (all_work_info->
             super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pWVar6 = (all_work_info->
             super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar9 = (long)pWVar6 - (long)pWVar5;
    if ((ulong)(lVar9 / 0x14) <= uVar11) break;
    std::
    priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
    ::push(&min_proc_work_q,(value_type *)((long)&pWVar5->proc_rank + lVar10));
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x14;
  }
  local_58 = all_move_info;
  std::
  __sort<__gnu_cxx::__normal_iterator<diy::detail::WorkInfo*,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<diy::detail::decide_move_info(std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>&,std::vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>>&)::_lambda(diy::detail::WorkInfo&,diy::detail::WorkInfo&)_2_>>
            (pWVar5,pWVar6,lVar9 % 0x14);
  lVar10 = 0x10;
  uVar11 = 0;
  while( true ) {
    pWVar5 = (all_work_info->
             super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(all_work_info->
                       super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar5) / 0x14) <= uVar11
       ) break;
    uVar1 = *(uint *)((long)pWVar5 + lVar10 + -8);
    if (uVar1 < *(int *)((long)pWVar5 + lVar10 + -4) -
                (min_proc_work_q.c.
                 super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->proc_work) {
      iVar2 = *(int *)((long)pWVar5 + lVar10 + -0x10);
      if ((iVar2 != (min_proc_work_q.c.
                     super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->proc_rank) &&
         (1 < *(int *)((long)&pWVar5->proc_rank + lVar10))) {
        iVar3 = *(int *)((long)pWVar5 + lVar10 + -0xc);
        local_64.move_gid = iVar3;
        local_64.src_proc = iVar2;
        local_64.dst_proc =
             (min_proc_work_q.c.
              super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->proc_rank;
        std::vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>::push_back
                  (local_58,&local_64);
        work_info.proc_rank =
             (min_proc_work_q.c.
              super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->proc_rank;
        work_info.top_gid =
             (min_proc_work_q.c.
              super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->top_gid;
        uVar7 = (min_proc_work_q.c.
                 super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->top_work;
        uVar8 = (min_proc_work_q.c.
                 super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->proc_work;
        stack0xffffffffffffff88 =
             CONCAT44(uStack_74,
                      (min_proc_work_q.c.
                       super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->nlids);
        work_info.top_work = uVar7;
        if ((uint)uVar7 < uVar1) {
          work_info.top_gid = iVar3;
          work_info.top_work = uVar1;
        }
        work_info.proc_work = uVar8 + uVar1;
        std::
        priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
        ::pop(&min_proc_work_q);
        std::
        priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
        ::push(&min_proc_work_q,&work_info);
      }
    }
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x14;
  }
  std::_Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::~_Vector_base
            ((_Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *)
             &min_proc_work_q);
  return;
}

Assistant:

inline void decide_move_info(std::vector<WorkInfo>&        all_work_info,          // global work info
                      std::vector<MoveInfo>&        all_move_info)          // (output) move info for all moves
{
    all_move_info.clear();

    // move all blocks with an approximation to the longest processing time first (LPTF) scheduling algorithm
    // https://en.wikipedia.org/wiki/Longest-processing-time-first_scheduling
    // we iteratively move the heaviest block to lightest proc
    // constrained by only recording the heaviest block for each proc, not all blocks

    // minimum proc_work priority queue, top is min proc_work
    auto cmp = [&](WorkInfo& a, WorkInfo& b) { return a.proc_work > b.proc_work; };
    std::priority_queue<WorkInfo, std::vector<WorkInfo>, decltype(cmp)> min_proc_work_q(cmp);
    for (auto i = 0; i < all_work_info.size(); i++)
        min_proc_work_q.push(all_work_info[i]);

    // sort all_work_info by descending top_work
    std::sort(all_work_info.begin(), all_work_info.end(),
            [&](WorkInfo& a, WorkInfo& b) { return a.top_work > b.top_work; });

    // walk the all_work_info vector in descending top_work order
    // move the next heaviest block to the lightest proc
    for (auto i = 0; i < all_work_info.size(); i++)
    {
        auto src_work_info = all_work_info[i];                      // heaviest block
        auto dst_work_info = min_proc_work_q.top();                 // lightest proc

        // sanity check that the move makes sense
        if (src_work_info.proc_work - dst_work_info.proc_work > src_work_info.top_work &&   // improve load balance
                src_work_info.proc_rank != dst_work_info.proc_rank &&                       // not self
                src_work_info.nlids > 1)                                                    // don't leave a proc with no blocks
        {
            MoveInfo move_info;
            move_info.src_proc  = src_work_info.proc_rank;
            move_info.dst_proc  = dst_work_info.proc_rank;
            move_info.move_gid  = src_work_info.top_gid;
            all_move_info.push_back(move_info);

            // update the min_proc_work priority queue
            auto work_info = min_proc_work_q.top();                 // lightest proc
            work_info.proc_work += src_work_info.top_work;
            if (work_info.top_work < src_work_info.top_work)
            {
                work_info.top_work = src_work_info.top_work;
                work_info.top_gid  = src_work_info.top_gid;
            }
            min_proc_work_q.pop();
            min_proc_work_q.push(work_info);
        }
    }
}